

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 11.cpp
# Opt level: O0

int main(void)

{
  ostream *poVar1;
  int local_1c;
  char acStack_18 [4];
  int x;
  char eme [8];
  
  eme[4] = '\0';
  eme[5] = '\0';
  eme[6] = '\0';
  eme[7] = '\0';
  _acStack_18 = 0x6d35333b315b1b;
  std::operator<<((ostream *)&std::cout,acStack_18);
  std::operator<<((ostream *)&std::cout,"Qual o dia em que nietzsche nasceu?");
  std::istream::operator>>((istream *)&std::cin,&local_1c);
  switch(local_1c) {
  case 10:
    poVar1 = std::operator<<((ostream *)&std::cout,
                             "Cinco dias a mais e voce estaria correto. Nietzsche nasceu dia 15 de outubro de 1844."
                            );
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    break;
  default:
    poVar1 = std::operator<<((ostream *)&std::cout,"Sorry, tente novamente.");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    break;
  case 0xf:
    poVar1 = std::operator<<((ostream *)&std::cout,
                             "YES! No dia 15 de outubro de 1844 nasceu a Aurora niilista dual! um espetaculo."
                            );
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    break;
  case 0x14:
    poVar1 = std::operator<<((ostream *)&std::cout,
                             "Cinco dias a menos e voce estaria correto. Nieyzsche nasceu dia 15 de outubro de 1944."
                            );
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    break;
  case 0x1e:
    poVar1 = std::operator<<((ostream *)&std::cout,
                             "Quinze dias a menos e voce estaria correto. Nietzsche nasceu dia 15 de outubro de 1944."
                            );
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  }
  return 0;
}

Assistant:

int main()
{
    char eme[] = {0x1b, '[', '1', ';', '3', '5', 'm', 0};
    cout << eme;
    int x;

    cout << "Qual o dia em que nietzsche nasceu?";
    cin >> x;

    switch (x)
    {
    case 15:
        cout << "YES! No dia 15 de outubro de 1844 nasceu a Aurora niilista dual! um espetaculo." << endl;
        break;
    case 10:
        cout << "Cinco dias a mais e voce estaria correto. Nietzsche nasceu dia 15 de outubro de 1844." << endl;
        break;
    case 20:
        cout << "Cinco dias a menos e voce estaria correto. Nieyzsche nasceu dia 15 de outubro de 1944." << endl;
        break;
    case 30:
        cout << "Quinze dias a menos e voce estaria correto. Nietzsche nasceu dia 15 de outubro de 1944." << endl;
        break;
    default:
        cout << "Sorry, tente novamente." << endl;
        break;
    }

    return 0;
}